

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

bool __thiscall QDomNodeListPrivate::checkNode(QDomNodeListPrivate *this,QDomNodePrivate *p)

{
  char16_t *pcVar1;
  long lVar2;
  QArrayData *pQVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  
  if ((p != (QDomNodePrivate *)0x0) && (iVar6 = (*p->_vptr_QDomNodePrivate[0xb])(p), iVar6 == 1)) {
    pcVar1 = (this->nsURI).d.ptr;
    if (pcVar1 == (char16_t *)0x0) {
      pQVar3 = &((p->name).d.d)->super_QArrayData;
      pcVar1 = (p->name).d.ptr;
      lVar2 = (p->name).d.size;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (lVar2 == (this->tagname).d.size) {
        QVar9.m_data = pcVar1;
        QVar9.m_size = lVar2;
        QVar12.m_data = (this->tagname).d.ptr;
        QVar12.m_size = lVar2;
        uVar5 = QtPrivate::equalStrings(QVar9,QVar12);
      }
      else {
        uVar5 = 0;
      }
      if (pQVar3 == (QArrayData *)0x0) {
        return (bool)uVar5;
      }
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
        return (bool)uVar5;
      }
      QArrayData::deallocate(pQVar3,2,0x10);
      return (bool)uVar5;
    }
    lVar2 = (p->name).d.size;
    if (((lVar2 == (this->tagname).d.size) &&
        (QVar7.m_data = (p->name).d.ptr, QVar7.m_size = lVar2, QVar10.m_data = (this->tagname).d.ptr
        , QVar10.m_size = lVar2, cVar4 = QtPrivate::equalStrings(QVar7,QVar10), cVar4 != '\0')) &&
       (lVar2 = (p->namespaceURI).d.size, lVar2 == (this->nsURI).d.size)) {
      QVar8.m_data = (p->namespaceURI).d.ptr;
      QVar8.m_size = lVar2;
      QVar11.m_data = pcVar1;
      QVar11.m_size = lVar2;
      uVar5 = QtPrivate::equalStrings(QVar8,QVar11);
      return (bool)uVar5;
    }
  }
  return false;
}

Assistant:

bool QDomNodeListPrivate::checkNode(QDomNodePrivate *p) const
{
    return p && p->isElement() && (nsURI.isNull()
                                   ? p->nodeName() == tagname
                                   : p->name == tagname && p->namespaceURI == nsURI);
}